

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O0

bool __thiscall
irr::core::string<unsigned_long>::operator==
          (string<unsigned_long> *this,string<unsigned_long> *other)

{
  bool bVar1;
  int local_24;
  s32 i;
  string<unsigned_long> *other_local;
  string<unsigned_long> *this_local;
  
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (this->array[local_24] != 0) {
      bVar1 = other->array[local_24] != 0;
    }
    if (!bVar1) break;
    if (this->array[local_24] != other->array[local_24]) {
      return false;
    }
    local_24 = local_24 + 1;
  }
  return this->used == other->used;
}

Assistant:

bool operator ==(const string<T>& other) const
	{
		for(s32 i=0; array[i] && other.array[i]; ++i)
			if (array[i] != other.array[i])
				return false;

		return used == other.used;
	}